

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

void __thiscall
duckdb::WindowSegmentTreePart::EvaluateLeaves
          (WindowSegmentTreePart *this,WindowSegmentTreeGlobalState *tree,idx_t *begins,idx_t *ends,
          idx_t *bounds,idx_t count,idx_t row_idx,FramePart frame_part,FramePart leaf_part)

{
  WindowExcludeMode WVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  data_ptr_t state_ptr;
  ulong uVar4;
  idx_t *piVar5;
  idx_t rid;
  idx_t iVar6;
  idx_t cur_row;
  ulong begin;
  idx_t end;
  bool bVar7;
  
  pdVar2 = (this->statef).data;
  WVar1 = (tree->tree->super_WindowAggregator).exclude_mode;
  piVar5 = ends;
  if (frame_part == LEFT) {
    piVar5 = bounds;
  }
  bVar7 = frame_part == RIGHT;
  if (!bVar7) {
    bounds = begins;
  }
  iVar6 = 0;
  do {
    if (count == iVar6) {
      FlushStates(this,false);
      return;
    }
    if (!bVar7 || WVar1 != CURRENT_ROW) {
      begin = begins[iVar6];
    }
    else {
      begin = row_idx + 1;
    }
    uVar3 = bounds[iVar6];
    if (begin <= uVar3) {
      begin = uVar3;
    }
    end = row_idx;
    if (frame_part != LEFT || WVar1 != CURRENT_ROW) {
      end = ends[iVar6];
    }
    state_ptr = *(data_ptr_t *)(pdVar2 + iVar6 * 8);
    uVar4 = piVar5[iVar6];
    if (uVar4 <= end) {
      end = uVar4;
    }
    if ((uVar3 <= row_idx && ((leaf_part != RIGHT && bVar7) && WVar1 == TIES)) && (row_idx < uVar4))
    {
      WindowSegmentValue(this,tree,0,row_idx,row_idx + 1,state_ptr);
    }
    if (begin < end) {
      if ((end ^ begin) < 0x10) {
        if (leaf_part != RIGHT) {
LAB_01aabea4:
          WindowSegmentValue(this,tree,0,begin,end,state_ptr);
        }
      }
      else {
        if ((leaf_part != RIGHT) && (begin != (begin & 0xfffffffffffffff0))) {
          WindowSegmentValue(this,tree,0,begin,(begin & 0xfffffffffffffff0) + 0x10,state_ptr);
        }
        if ((leaf_part != LEFT) && (begin = end & 0xfffffffffffffff0, end != begin))
        goto LAB_01aabea4;
      }
    }
    iVar6 = iVar6 + 1;
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

void WindowSegmentTreePart::EvaluateLeaves(const WindowSegmentTreeGlobalState &tree, const idx_t *begins,
                                           const idx_t *ends, const idx_t *bounds, idx_t count, idx_t row_idx,
                                           FramePart frame_part, FramePart leaf_part) {

	auto fdata = FlatVector::GetData<data_ptr_t>(statef);

	// For order-sensitive aggregates, we have to process the ragged leaves in two pieces.
	// The left side have to be added before the main tree followed by the ragged right sides.
	// The current row is the leftmost value of the right hand side.
	const bool compute_left = leaf_part != FramePart::RIGHT;
	const bool compute_right = leaf_part != FramePart::LEFT;
	const auto exclude_mode = tree.tree.exclude_mode;
	const bool begin_on_curr_row = frame_part == FramePart::RIGHT && exclude_mode == WindowExcludeMode::CURRENT_ROW;
	const bool end_on_curr_row = frame_part == FramePart::LEFT && exclude_mode == WindowExcludeMode::CURRENT_ROW;
	// with EXCLUDE TIES, in addition to the frame part right of the peer group's end, we also need to consider the
	// current row
	const bool add_curr_row = compute_left && frame_part == FramePart::RIGHT && exclude_mode == WindowExcludeMode::TIES;

	// We need the full range of the frame to clamp
	auto frame_begins = FrameBegins(begins, ends, bounds, frame_part);
	auto frame_ends = FrameEnds(begins, ends, bounds, frame_part);

	for (idx_t rid = 0, cur_row = row_idx; rid < count; ++rid, ++cur_row) {
		auto state_ptr = fdata[rid];

		const auto frame_begin = frame_begins[rid];
		auto begin = MaxValue(begin_on_curr_row ? cur_row + 1 : begins[rid], frame_begin);

		const auto frame_end = frame_ends[rid];
		auto end = MinValue(end_on_curr_row ? cur_row : ends[rid], frame_end);
		if (add_curr_row && frame_begin <= cur_row && cur_row < frame_end) {
			WindowSegmentValue(tree, 0, cur_row, cur_row + 1, state_ptr);
		}
		if (begin >= end) {
			continue;
		}

		idx_t parent_begin = begin / tree.TREE_FANOUT;
		idx_t parent_end = end / tree.TREE_FANOUT;
		if (parent_begin == parent_end) {
			if (compute_left) {
				WindowSegmentValue(tree, 0, begin, end, state_ptr);
			}
			continue;
		}

		idx_t group_begin = parent_begin * tree.TREE_FANOUT;
		if (begin != group_begin && compute_left) {
			WindowSegmentValue(tree, 0, begin, group_begin + tree.TREE_FANOUT, state_ptr);
		}
		idx_t group_end = parent_end * tree.TREE_FANOUT;
		if (end != group_end && compute_right) {
			WindowSegmentValue(tree, 0, group_end, end, state_ptr);
		}
	}
	FlushStates(false);
}